

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

bool fmt::v8::detail::dragonbox::cache_accessor<double>::compute_mul_parity
               (carrier_uint two_f,cache_entry_type *cache,int beta_minus_1)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  
  if (beta_minus_1 < 1) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/fmt/format-inl.h"
                ,0x750,"");
  }
  if (beta_minus_1 < 0x40) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = two_f;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (ulong)cache->internal_;
    return (SUB168(auVar1 * auVar2,8) + *(long *)((long)&cache->internal_ + 8) * two_f >>
            ((ulong)(byte)(0x40 - (char)beta_minus_1) & 0x3f) & 1) != 0;
  }
  assert_fail("/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/fmt/format-inl.h"
              ,0x751,"");
}

Assistant:

static bool compute_mul_parity(carrier_uint two_f,
                                 const cache_entry_type& cache,
                                 int beta_minus_1) FMT_NOEXCEPT {
    FMT_ASSERT(beta_minus_1 >= 1, "");
    FMT_ASSERT(beta_minus_1 < 64, "");

    return ((umul192_middle64(two_f, cache) >> (64 - beta_minus_1)) & 1) != 0;
  }